

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O2

void __thiscall llama_grammar_parser::print(llama_grammar_parser *this,FILE *file)

{
  pointer plVar1;
  long lVar2;
  int __c;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  runtime_error *prVar5;
  uint __val;
  long lVar6;
  unsigned_long __val_00;
  pointer pvVar7;
  uint local_124;
  llama_grammar_element elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long local_70;
  long local_68;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symbol_id_names;
  
  symbol_id_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symbol_id_names._M_t._M_impl.super__Rb_tree_header._M_header;
  symbol_id_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  symbol_id_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symbol_id_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  symbol_id_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symbol_id_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var4 = (this->symbol_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->symbol_ids)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    pmVar3 = std::
             map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&symbol_id_names,&p_Var4[2]._M_color);
    std::__cxx11::string::_M_assign((string *)pmVar3);
  }
  local_70 = ((long)(this->rules).
                    super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->rules).
                   super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar6 = 0;
  do {
    if (lVar6 == local_70) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&symbol_id_names._M_t);
      return;
    }
    pvVar7 = (this->rules).
             super__Vector_base<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __val = (uint)lVar6;
    plVar1 = *(pointer *)
              ((long)&pvVar7[lVar6].
                      super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                      ._M_impl.super__Vector_impl_data + 8);
    local_124 = __val;
    if ((pvVar7[lVar6].
         super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>._M_impl.
         super__Vector_impl_data._M_start == plVar1) || (plVar1[-1].type != LLAMA_GRETYPE_END)) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_110,__val);
      std::operator+(&local_f0,"malformed rule, does not end with LLAMA_GRETYPE_END: ",&local_110);
      std::runtime_error::runtime_error(prVar5,(string *)&local_f0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_68 = lVar6;
    pmVar3 = std::
             map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&symbol_id_names,&local_124);
    pvVar7 = pvVar7 + lVar6;
    fprintf((FILE *)file,"%s ::= ",(pmVar3->_M_dataplus)._M_p);
    plVar1 = *(pointer *)
              ((long)&(pvVar7->
                      super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                      )._M_impl.super__Vector_impl_data + 8);
    lVar6 = *(long *)&(pvVar7->
                      super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                      )._M_impl.super__Vector_impl_data;
    for (__val_00 = 0; ((long)plVar1 - lVar6 >> 3) - 1U != __val_00; __val_00 = __val_00 + 1) {
      lVar2 = *(long *)&(pvVar7->
                        super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                        )._M_impl.super__Vector_impl_data;
      elem = *(llama_grammar_element *)(lVar2 + __val_00 * 8);
      switch((ulong)elem & 0xffffffff) {
      case 0:
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_b0,local_124);
        std::operator+(&local_90,"unexpected end of rule: ",&local_b0);
        std::operator+(&local_110,&local_90,",");
        std::__cxx11::to_string(&local_d0,__val_00);
        std::operator+(&local_f0,&local_110,&local_d0);
        std::runtime_error::runtime_error(prVar5,(string *)&local_f0);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      case 1:
        fwrite("| ",2,1,(FILE *)file);
        break;
      case 2:
        pmVar3 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(&symbol_id_names,&elem.value);
        fprintf((FILE *)file,"%s ",(pmVar3->_M_dataplus)._M_p);
        break;
      case 3:
        __c = 0x5b;
        goto LAB_001d9663;
      case 4:
        fwrite("[^",2,1,(FILE *)file);
        goto LAB_001d966c;
      case 5:
        if ((__val_00 == 0) || (4 < *(int *)(lVar2 + -8 + __val_00 * 8) - 3U)) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_b0,local_124);
          std::operator+(&local_90,"LLAMA_GRETYPE_CHAR_RNG_UPPER without preceding char: ",&local_b0
                        );
          std::operator+(&local_110,&local_90,",");
          std::__cxx11::to_string(&local_d0,__val_00);
          std::operator+(&local_f0,&local_110,&local_d0);
          std::runtime_error::runtime_error(prVar5,(string *)&local_f0);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __c = 0x2d;
LAB_001d9663:
        fputc(__c,(FILE *)file);
LAB_001d966c:
LAB_001d96be:
        print_grammar_char(file,elem.value);
        break;
      case 6:
        if ((__val_00 == 0) || (4 < *(int *)(lVar2 + -8 + __val_00 * 8) - 3U)) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_b0,local_124);
          std::operator+(&local_90,"LLAMA_GRETYPE_CHAR_ALT without preceding char: ",&local_b0);
          std::operator+(&local_110,&local_90,",");
          std::__cxx11::to_string(&local_d0,__val_00);
          std::operator+(&local_f0,&local_110,&local_d0);
          std::runtime_error::runtime_error(prVar5,(string *)&local_f0);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001d96be;
      case 7:
        fputc(0x2e,(FILE *)file);
      }
      if ((elem.type - LLAMA_GRETYPE_CHAR < 5) &&
         (2 < *(int *)(*(long *)&(pvVar7->
                                 super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                                 )._M_impl.super__Vector_impl_data + 8 + __val_00 * 8) - 5U)) {
        fwrite("] ",2,1,(FILE *)file);
      }
    }
    fputc(10,(FILE *)file);
    lVar6 = local_68 + 1;
  } while( true );
}

Assistant:

void llama_grammar_parser::print(FILE * file) {
    try {
        std::map<uint32_t, std::string> symbol_id_names;
        for (const auto & kv : symbol_ids) {
            symbol_id_names[kv.second] = kv.first;
        }
        for (size_t i = 0, end = rules.size(); i < end; i++) {
            // fprintf(file, "%zu: ", i);
            // print_rule_binary(file, rules[i]);
            print_rule(file, uint32_t(i), rules[i], symbol_id_names);
            // fprintf(file, "\n");
        }
    } catch (const std::exception & err) {
        fprintf(stderr, "\n%s: error printing grammar: %s\n", __func__, err.what());
    }
}